

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int RunPCIScan(undefined8 param_1,undefined2 param_2,undefined8 param_3,Commandline *param_4)

{
  byte bVar1;
  uint uVar2;
  ostream *poVar3;
  allocator local_b1;
  string local_b0 [32];
  ostream *local_90;
  unsigned_long pciId;
  undefined4 local_80;
  undefined2 local_7c;
  RouterAccess local_78 [8];
  RouterAccess device;
  Commandline *args_local;
  string *gw_local;
  uint16_t port_local;
  AmsNetId netid_local;
  
  pciId._0_4_ = (undefined4)param_1;
  pciId._4_2_ = (undefined2)((ulong)param_1 >> 0x20);
  local_80 = (undefined4)pciId;
  local_7c = pciId._4_2_;
  bhf::ads::RouterAccess::RouterAccess(local_78,param_3,CONCAT26(pciId._6_2_,(int6)param_1),param_2)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"pciscan pci_id is missing",&local_b1);
  poVar3 = (ostream *)bhf::Commandline::Pop<unsigned_long>(param_4,(string *)local_b0);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  local_90 = poVar3;
  uVar2 = std::numeric_limits<unsigned_int>::max();
  if (local_90 <= (ostream *)(ulong)uVar2) {
    local_90 = (ostream *)((long)local_90 << 0x20);
  }
  bVar1 = bhf::ads::RouterAccess::PciScan((ulong)local_78,local_90);
  bhf::ads::RouterAccess::~RouterAccess(local_78);
  return (uint)(bVar1 & 1);
}

Assistant:

int RunPCIScan(const AmsNetId netid, const uint16_t port, const std::string& gw, bhf::Commandline& args)
{
    const auto device = bhf::ads::RouterAccess{ gw, netid, port };
    auto pciId = args.Pop<uint64_t>("pciscan pci_id is missing");

    /* allow subVendorId/SystemId to be omitted from cmd */
    if (std::numeric_limits<uint32_t>::max() >= pciId) {
        pciId <<= 32;
    }
    return device.PciScan(pciId, std::cout);
}